

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompareNodeSetString
              (xmlXPathParserContextPtr ctxt,int inf,int strict,xmlXPathObjectPtr arg,
              xmlXPathObjectPtr s)

{
  xmlNodeSetPtr pxVar1;
  xmlChar *val;
  xmlXPathObjectPtr pxVar2;
  xmlChar *str2;
  xmlNodeSetPtr ns;
  int ret;
  int i;
  xmlXPathObjectPtr s_local;
  xmlXPathObjectPtr arg_local;
  int strict_local;
  int inf_local;
  xmlXPathParserContextPtr ctxt_local;
  
  ns._0_4_ = 0;
  if (((s == (xmlXPathObjectPtr)0x0) || (arg == (xmlXPathObjectPtr)0x0)) ||
     ((arg->type != XPATH_NODESET && (arg->type != XPATH_XSLT_TREE)))) {
    xmlXPathReleaseObject(ctxt->context,arg);
    xmlXPathReleaseObject(ctxt->context,s);
    ctxt_local._4_4_ = 0;
  }
  else {
    pxVar1 = arg->nodesetval;
    if (pxVar1 != (xmlNodeSetPtr)0x0) {
      for (ns._4_4_ = 0; ns._4_4_ < pxVar1->nodeNr; ns._4_4_ = ns._4_4_ + 1) {
        val = xmlXPathCastNodeToString(pxVar1->nodeTab[ns._4_4_]);
        if (val != (xmlChar *)0x0) {
          pxVar2 = xmlXPathCacheNewString(ctxt->context,val);
          valuePush(ctxt,pxVar2);
          (*xmlFree)(val);
          pxVar2 = xmlXPathCacheObjectCopy(ctxt->context,s);
          valuePush(ctxt,pxVar2);
          ns._0_4_ = xmlXPathCompareValues(ctxt,inf,strict);
          if ((int)ns != 0) break;
        }
      }
    }
    xmlXPathReleaseObject(ctxt->context,arg);
    xmlXPathReleaseObject(ctxt->context,s);
    ctxt_local._4_4_ = (int)ns;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXPathCompareNodeSetString(xmlXPathParserContextPtr ctxt, int inf, int strict,
	                    xmlXPathObjectPtr arg, xmlXPathObjectPtr s) {
    int i, ret = 0;
    xmlNodeSetPtr ns;
    xmlChar *str2;

    if ((s == NULL) || (arg == NULL) ||
	((arg->type != XPATH_NODESET) && (arg->type != XPATH_XSLT_TREE))) {
	xmlXPathReleaseObject(ctxt->context, arg);
	xmlXPathReleaseObject(ctxt->context, s);
        return(0);
    }
    ns = arg->nodesetval;
    if (ns != NULL) {
	for (i = 0;i < ns->nodeNr;i++) {
	     str2 = xmlXPathCastNodeToString(ns->nodeTab[i]);
	     if (str2 != NULL) {
		 valuePush(ctxt,
			   xmlXPathCacheNewString(ctxt->context, str2));
		 xmlFree(str2);
		 valuePush(ctxt, xmlXPathCacheObjectCopy(ctxt->context, s));
		 ret = xmlXPathCompareValues(ctxt, inf, strict);
		 if (ret)
		     break;
	     }
	}
    }
    xmlXPathReleaseObject(ctxt->context, arg);
    xmlXPathReleaseObject(ctxt->context, s);
    return(ret);
}